

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QMimeType>::reallocateAndGrow
          (QArrayDataPointer<QMimeType> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMimeType> *old)

{
  QMimeType *pQVar1;
  Data *pDVar2;
  QMimeType *pQVar3;
  undefined1 *puVar4;
  long lVar5;
  QMimeType *data;
  QMimeType *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QMimeType> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QMimeType> *)0x0 && where == GrowsAtEnd) &&
       (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QtPrivate::QMovableArrayOps<QMimeType>::reallocate
                ((QMovableArrayOps<QMimeType> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QMimeType *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pQVar3 = local_48.ptr;
    if (local_48.ptr == (QMimeType *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar5 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QMimeType> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar5) {
            pQVar6 = this->ptr;
            pQVar1 = pQVar6 + lVar5;
            do {
              QMimeType::QMimeType(pQVar3 + local_48.size,pQVar6);
              pQVar6 = pQVar6 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar6 < pQVar1);
          }
        }
        else if (0 < lVar5) {
          pQVar6 = this->ptr;
          pQVar1 = pQVar6 + lVar5;
          do {
            QMimeType::QMimeType(pQVar3 + local_48.size,pQVar6);
            pQVar6 = pQVar6 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar6 < pQVar1);
        }
      }
      pDVar2 = this->d;
      pQVar3 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar4 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pQVar3;
      local_48.size = (qsizetype)puVar4;
      if (old != (QArrayDataPointer<QMimeType> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = pQVar3;
        local_48.size = old->size;
        old->size = (qsizetype)puVar4;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }